

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O2

vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *
deqp::gles2::Functional::addRangeToList
          (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
           *__return_storage_ptr__,
          vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *oldList,
          IVec2 *newRange)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  pointer b;
  IVec2 curRange;
  Vector<int,_2> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (b = (oldList->super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
      (b != (oldList->super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
            )._M_impl.super__Vector_impl_data._M_finish &&
      (b->m_data[1] + b->m_data[0] < newRange->m_data[0])); b = b + 1) {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
              (__return_storage_ptr__,b);
  }
  tcu::Vector<int,_2>::Vector(&local_30,newRange);
  for (; b != (oldList->
              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>).
              _M_impl.super__Vector_impl_data._M_finish; b = b + 1) {
    bVar2 = rangesIntersect(&local_30,b);
    if (!bVar2) break;
    iVar3 = b->m_data[0];
    iVar1 = iVar3;
    if (local_30.m_data[0] < iVar3) {
      iVar1 = local_30.m_data[0];
    }
    iVar3 = iVar3 + b->m_data[1];
    if (iVar3 < local_30.m_data[0] + local_30.m_data[1]) {
      iVar3 = local_30.m_data[0] + local_30.m_data[1];
    }
    local_30.m_data[1] = iVar3 - iVar1;
    local_30.m_data[0] = iVar1;
  }
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            (__return_storage_ptr__,&local_30);
  for (; b != (oldList->
              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>).
              _M_impl.super__Vector_impl_data._M_finish; b = b + 1) {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
              (__return_storage_ptr__,b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::IVec2> addRangeToList (const std::vector<tcu::IVec2>& oldList, const tcu::IVec2& newRange)
{
	DE_ASSERT(newRange.y() > 0);

	std::vector<tcu::IVec2>					newList;
	std::vector<tcu::IVec2>::const_iterator	oldListIter	= oldList.begin();

	// Append ranges that end before the new range.
	for (; oldListIter != oldList.end() && oldListIter->x()+oldListIter->y() < newRange.x(); ++oldListIter)
		newList.push_back(*oldListIter);

	// Join any ranges that intersect new range
	{
		tcu::IVec2 curRange = newRange;
		while (oldListIter != oldList.end() && rangesIntersect(curRange, *oldListIter))
		{
			curRange = unionRanges(curRange, *oldListIter);
			++oldListIter;
		}

		newList.push_back(curRange);
	}

	// Append remaining ranges.
	for (; oldListIter != oldList.end(); oldListIter++)
		newList.push_back(*oldListIter);

	DE_ASSERT(isRangeListValid(newList.begin(), newList.end()));

	return newList;
}